

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O3

int codepoint(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  lua_Integer def;
  lua_Integer lVar4;
  char *s;
  size_t len;
  utfint code;
  ulong local_40;
  uint local_34;
  
  pcVar3 = luaL_checklstring(L,1,&local_40);
  def = luaL_optinteger(L,2,1);
  if (def < 0) {
    if (local_40 < (ulong)-def) {
      def = 0;
    }
    else {
      def = def + local_40 + 1;
    }
  }
  lVar4 = luaL_optinteger(L,3,def);
  if (lVar4 < 0) {
    if (local_40 < (ulong)-lVar4) {
      lVar4 = 0;
    }
    else {
      lVar4 = lVar4 + local_40 + 1;
    }
  }
  iVar1 = lua_toboolean(L,4);
  if (def < 1) {
    luaL_argerror(L,2,"out of bounds");
  }
  if ((long)local_40 < lVar4) {
    luaL_argerror(L,3,"out of bounds");
  }
  iVar2 = 0;
  if (def <= lVar4) {
    if (lVar4 - def < 0x7fffffff) {
      luaL_checkstack(L,(int)(lVar4 - def) + 1,"string slice too long");
      s = pcVar3 + def + -1;
      iVar2 = 0;
      if (s < pcVar3 + lVar4) {
        iVar2 = 0;
        do {
          s = utf8_decode(s,&local_34,(uint)(iVar1 == 0));
          if (s == (char *)0x0) {
            pcVar3 = "invalid UTF-8 code";
            goto LAB_00154465;
          }
          lua_pushinteger(L,(ulong)local_34);
          iVar2 = iVar2 + 1;
        } while (s < pcVar3 + lVar4);
      }
    }
    else {
      pcVar3 = "string slice too long";
LAB_00154465:
      iVar2 = luaL_error(L,pcVar3);
    }
  }
  return iVar2;
}

Assistant:

static int codepoint (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer posi = u_posrelat(luaL_optinteger(L, 2, 1), len);
  lua_Integer pose = u_posrelat(luaL_optinteger(L, 3, posi), len);
  int lax = lua_toboolean(L, 4);
  int n;
  const char *se;
  luaL_argcheck(L, posi >= 1, 2, "out of bounds");
  luaL_argcheck(L, pose <= (lua_Integer)len, 3, "out of bounds");
  if (posi > pose) return 0;  /* empty interval; return no values */
  if (pose - posi >= INT_MAX)  /* (lua_Integer -> int) overflow? */
    return luaL_error(L, "string slice too long");
  n = (int)(pose -  posi) + 1;  /* upper bound for number of returns */
  luaL_checkstack(L, n, "string slice too long");
  n = 0;  /* count the number of returns */
  se = s + pose;  /* string end */
  for (s += posi - 1; s < se;) {
    utfint code;
    s = utf8_decode(s, &code, !lax);
    if (s == NULL)
      return luaL_error(L, MSGInvalid);
    lua_pushinteger(L, code);
    n++;
  }
  return n;
}